

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O0

char * str_sa_inet6(nng_sockaddr_in6 *sa,char *buf,size_t bufsz)

{
  char *pcVar1;
  char local_58 [8];
  char istr [46];
  uint8_t *p_bytes;
  size_t bufsz_local;
  char *buf_local;
  nng_sockaddr_in6 *sa_local;
  
  register0x00000000 = &sa->sa_port;
  if (sa->sa_scope == 0) {
    pcVar1 = nni_inet_ntop(sa->sa_addr,local_58);
    snprintf(buf,bufsz,"[%s]:%u",pcVar1,
             (ulong)((uint)(byte)*stack0xffffffffffffffd8 * 0x100 +
                    (uint)*(byte *)((long)stack0xffffffffffffffd8 + 1)));
  }
  else {
    pcVar1 = nni_inet_ntop(sa->sa_addr,local_58);
    snprintf(buf,bufsz,"[%s%%%u]:%u",pcVar1,(ulong)sa->sa_scope,
             (ulong)((uint)(byte)*stack0xffffffffffffffd8 * 0x100 +
                    (uint)*(byte *)((long)stack0xffffffffffffffd8 + 1)));
  }
  return buf;
}

Assistant:

static const char *
str_sa_inet6(const nng_sockaddr_in6 *sa, char *buf, size_t bufsz)
{
	const uint8_t *p_bytes = (uint8_t *) &sa->sa_port;
	char           istr[46];

	if (sa->sa_scope) {
		snprintf(buf, bufsz, "[%s%%%u]:%u",
		    nni_inet_ntop(sa->sa_addr, istr), sa->sa_scope,
		    (((uint16_t) (p_bytes[0])) << 8) + p_bytes[1]);
	} else {
		snprintf(buf, bufsz, "[%s]:%u",
		    nni_inet_ntop(sa->sa_addr, istr),
		    (((uint16_t) (p_bytes[0])) << 8) + p_bytes[1]);
	}
	return (buf);
}